

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cte.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalCTE::BuildPipelines(PhysicalCTE *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  pointer prVar3;
  PipelineBuildState *pPVar4;
  MetaPipeline *this_01;
  reference pvVar5;
  shared_ptr<duckdb::Pipeline,_true> *this_02;
  reference_wrapper<const_duckdb::PhysicalOperator> *cte_scan;
  pointer prVar6;
  PhysicalOperator *local_40;
  type local_38;
  
  _Var1._M_head_impl =
       (this->super_PhysicalOperator).op_state.
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  _Var2._M_head_impl =
       (this->super_PhysicalOperator).sink_state.
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  pPVar4 = MetaPipeline::GetState(meta_pipeline);
  this_01 = MetaPipeline::CreateChildMetaPipeline
                      (meta_pipeline,current,&this->super_PhysicalOperator,REGULAR);
  this_00 = &(this->super_PhysicalOperator).children;
  pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,0);
  MetaPipeline::Build(this_01,pvVar5->_M_data);
  prVar6 = (this->cte_scans).
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar3 = (this->cte_scans).
           super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar6 != prVar3) {
    do {
      this_02 = MetaPipeline::GetBasePipeline(this_01);
      local_38 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_02);
      local_40 = prVar6->_M_data;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<duckdb::PhysicalOperator_const&,duckdb::Pipeline&>>
                ((_Hashtable<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>>,std::__detail::_Select1st,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pPVar4->cte_dependencies,&local_40);
      prVar6 = prVar6 + 1;
    } while (prVar6 != prVar3);
  }
  pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[](this_00,1);
  (*pvVar5->_M_data->_vptr_PhysicalOperator[0x26])(pvVar5->_M_data,current,meta_pipeline);
  return;
}

Assistant:

void PhysicalCTE::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	D_ASSERT(children.size() == 2);
	op_state.reset();
	sink_state.reset();

	auto &state = meta_pipeline.GetState();

	auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
	child_meta_pipeline.Build(children[0]);

	for (auto &cte_scan : cte_scans) {
		state.cte_dependencies.insert(make_pair(cte_scan, reference<Pipeline>(*child_meta_pipeline.GetBasePipeline())));
	}

	children[1].get().BuildPipelines(current, meta_pipeline);
}